

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cc
# Opt level: O0

int main(void)

{
  bool bVar1;
  unique_ptr<std::thread,_std::default_delete<std::thread>_> *thread;
  iterator __end1;
  iterator __begin1;
  list<std::unique_ptr<std::thread,_std::default_delete<std::thread>_>,_std::allocator<std::unique_ptr<std::thread,_std::default_delete<std::thread>_>_>_>
  *__range1;
  int i_1;
  list<std::unique_ptr<std::thread,_std::default_delete<std::thread>_>,_std::allocator<std::unique_ptr<std::thread,_std::default_delete<std::thread>_>_>_>
  threads;
  int i;
  CallbackQueue queue;
  Tracing context;
  allocator *this;
  CallbackQueue *in_stack_fffffffffffffdd0;
  _Self in_stack_fffffffffffffdd8;
  _Self in_stack_fffffffffffffde0;
  function<void_()> *in_stack_fffffffffffffde8;
  CallbackQueue *in_stack_fffffffffffffdf0;
  function<void_()> *in_stack_fffffffffffffe08;
  function<void_()> *in_stack_fffffffffffffe38;
  int local_1bc;
  int local_144;
  CallbackQueue local_140;
  allocator local_79;
  string local_78 [116];
  int local_4;
  
  local_4 = 0;
  this = &local_79;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_78,"main",this);
  demo::Tracing::Tracing((Tracing *)in_stack_fffffffffffffdf0,(string *)in_stack_fffffffffffffde8);
  std::__cxx11::string::~string(local_78);
  std::allocator<char>::~allocator((allocator<char> *)&local_79);
  capture_thread::testing::CallbackQueue::CallbackQueue
            (in_stack_fffffffffffffdf0,SUB81((ulong)in_stack_fffffffffffffde8 >> 0x38,0));
  for (local_144 = 0; local_144 < 10; local_144 = local_144 + 1) {
    std::bind<void(*)(int),int&>
              ((_func_void_int **)in_stack_fffffffffffffdd8._M_node,(int *)in_stack_fffffffffffffdd0
              );
    std::function<void()>::function<std::_Bind<void(*(int))(int)>,void>
              ((function<void_()> *)in_stack_fffffffffffffde0._M_node,
               (_Bind<void_(*(int))(int)> *)in_stack_fffffffffffffdd8._M_node);
    capture_thread::ThreadCrosser::WrapCall(in_stack_fffffffffffffe08);
    capture_thread::testing::CallbackQueue::Push
              (in_stack_fffffffffffffdf0,in_stack_fffffffffffffde8);
    std::function<void_()>::~function((function<void_()> *)0x110588);
    std::function<void_()>::~function((function<void_()> *)0x110595);
  }
  std::__cxx11::
  list<std::unique_ptr<std::thread,_std::default_delete<std::thread>_>,_std::allocator<std::unique_ptr<std::thread,_std::default_delete<std::thread>_>_>_>
  ::list((list<std::unique_ptr<std::thread,_std::default_delete<std::thread>_>,_std::allocator<std::unique_ptr<std::thread,_std::default_delete<std::thread>_>_>_>
          *)0x11067c);
  for (local_1bc = 0; local_1bc < 3; local_1bc = local_1bc + 1) {
    in_stack_fffffffffffffdf0 = &local_140;
    std::
    bind<void(*)(int,capture_thread::testing::CallbackQueue*),int&,capture_thread::testing::CallbackQueue*>
              ((_func_void_int_CallbackQueue_ptr **)in_stack_fffffffffffffdd8._M_node,
               (int *)in_stack_fffffffffffffdd0,(CallbackQueue **)this);
    std::function<void()>::
    function<std::_Bind<void(*(int,capture_thread::testing::CallbackQueue*))(int,capture_thread::testing::CallbackQueue*)>,void>
              ((function<void_()> *)in_stack_fffffffffffffde0._M_node,
               (_Bind<void_(*(int,_capture_thread::testing::CallbackQueue_*))(int,_capture_thread::testing::CallbackQueue_*)>
                *)in_stack_fffffffffffffdd8._M_node);
    anon_unknown.dwarf_7c90::NewThread(in_stack_fffffffffffffe38);
    std::__cxx11::
    list<std::unique_ptr<std::thread,std::default_delete<std::thread>>,std::allocator<std::unique_ptr<std::thread,std::default_delete<std::thread>>>>
    ::emplace_back<std::unique_ptr<std::thread,std::default_delete<std::thread>>>
              ((list<std::unique_ptr<std::thread,_std::default_delete<std::thread>_>,_std::allocator<std::unique_ptr<std::thread,_std::default_delete<std::thread>_>_>_>
                *)in_stack_fffffffffffffde0._M_node,
               (unique_ptr<std::thread,_std::default_delete<std::thread>_> *)
               in_stack_fffffffffffffdd8._M_node);
    std::unique_ptr<std::thread,_std::default_delete<std::thread>_>::~unique_ptr
              ((unique_ptr<std::thread,_std::default_delete<std::thread>_> *)
               in_stack_fffffffffffffdd0);
    std::function<void_()>::~function((function<void_()> *)0x11070d);
  }
  capture_thread::testing::CallbackQueue::Activate(in_stack_fffffffffffffdd0);
  capture_thread::testing::CallbackQueue::WaitUntilEmpty(in_stack_fffffffffffffdf0);
  capture_thread::testing::CallbackQueue::Terminate(in_stack_fffffffffffffdd0);
  std::__cxx11::
  list<std::unique_ptr<std::thread,_std::default_delete<std::thread>_>,_std::allocator<std::unique_ptr<std::thread,_std::default_delete<std::thread>_>_>_>
  ::begin((list<std::unique_ptr<std::thread,_std::default_delete<std::thread>_>,_std::allocator<std::unique_ptr<std::thread,_std::default_delete<std::thread>_>_>_>
           *)this);
  std::__cxx11::
  list<std::unique_ptr<std::thread,_std::default_delete<std::thread>_>,_std::allocator<std::unique_ptr<std::thread,_std::default_delete<std::thread>_>_>_>
  ::end((list<std::unique_ptr<std::thread,_std::default_delete<std::thread>_>,_std::allocator<std::unique_ptr<std::thread,_std::default_delete<std::thread>_>_>_>
         *)this);
  while( true ) {
    bVar1 = std::operator!=((_Self *)&stack0xfffffffffffffde0,(_Self *)&stack0xfffffffffffffdd8);
    if (!bVar1) break;
    in_stack_fffffffffffffdd0 =
         (CallbackQueue *)
         std::_List_iterator<std::unique_ptr<std::thread,_std::default_delete<std::thread>_>_>::
         operator*((_List_iterator<std::unique_ptr<std::thread,_std::default_delete<std::thread>_>_>
                    *)0x1107f0);
    std::unique_ptr<std::thread,_std::default_delete<std::thread>_>::operator->
              ((unique_ptr<std::thread,_std::default_delete<std::thread>_> *)0x1107ff);
    std::thread::join();
    std::_List_iterator<std::unique_ptr<std::thread,_std::default_delete<std::thread>_>_>::
    operator++((_List_iterator<std::unique_ptr<std::thread,_std::default_delete<std::thread>_>_> *)
               &stack0xfffffffffffffde0);
  }
  std::__cxx11::
  list<std::unique_ptr<std::thread,_std::default_delete<std::thread>_>,_std::allocator<std::unique_ptr<std::thread,_std::default_delete<std::thread>_>_>_>
  ::~list((list<std::unique_ptr<std::thread,_std::default_delete<std::thread>_>,_std::allocator<std::unique_ptr<std::thread,_std::default_delete<std::thread>_>_>_>
           *)0x110824);
  capture_thread::testing::CallbackQueue::~CallbackQueue(in_stack_fffffffffffffdd0);
  demo::Tracing::~Tracing((Tracing *)in_stack_fffffffffffffdd0);
  return local_4;
}

Assistant:

int main() {
  Tracing context(__func__);

  // Queue for passing work from the main thread to the worker threads. Created
  // in a paused state.
  CallbackQueue queue(false /*active*/);

  for (int i = 0; i < 10; ++i) {
    // One callback per unit of work that can be parallelized.
    queue.Push(ThreadCrosser::WrapCall(std::bind(&Compute, i)));
  }

  std::list<std::unique_ptr<std::thread>> threads;
  for (int i = 0; i < 3; ++i) {
    // An arbitrary number of threads.
    threads.emplace_back(NewThread(std::bind(&QueueThread, i, &queue)));
  }

  // Perform the computations.

  queue.Activate();
  queue.WaitUntilEmpty();
  queue.Terminate();

  for (const auto& thread : threads) {
    thread->join();
  }
}